

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O2

void apet_walk_to_room(CHAR_DATA *ch,int vnum)

{
  ROOM_INDEX_DATA *pRVar1;
  ROOM_INDEX_DATA *pRVar2;
  CHAR_DATA *pCVar3;
  ROOM_INDEX_DATA *pRVar4;
  allocator<char> local_66;
  allocator<char> local_65;
  int vnum_local;
  CHAR_DATA *ch_local;
  string local_58;
  string local_38;
  
  vnum_local = vnum;
  ch_local = ch;
  pRVar4 = get_room_index(vnum);
  pRVar1 = ch->in_room;
  if (pRVar1 != pRVar4) {
    walk_to_room(ch,pRVar4);
    pRVar4 = ch->in_room;
    pRVar2 = ch->leader->in_room;
    if (pRVar4 == pRVar1 || pRVar4 != pRVar2) {
      if (pRVar4 != pRVar2) {
        char_from_room(ch);
        char_to_room(ch,ch->leader->in_room);
      }
      do_say(ch,
             "I can\'t seem to lead us over there from here.  Try heading back to another part of town?"
            );
      pCVar3 = ch->leader;
      pCVar3->master = ch;
      ch->master = pCVar3;
    }
    else {
      WAIT_STATE(ch->leader,0xc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"apet_walk_to_room",&local_65);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"apet_walk_to_room",&local_66);
      CQueue::AddToQueue<void(*)(char_data*,int),char_data*&,int&>
                (&RS.Queue,2,&local_38,&local_58,apet_walk_to_room,&ch_local,&vnum_local);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_38);
    }
    return;
  }
  apet_at_room(ch,vnum);
  return;
}

Assistant:

void apet_walk_to_room(CHAR_DATA *ch, int vnum)
{
	ROOM_INDEX_DATA *room = get_room_index(vnum), *oldroom = ch->in_room;

	if (ch->in_room == room)
	{
		apet_at_room(ch, vnum);
		return;
	}

	walk_to_room(ch, room);

	if (ch->in_room == oldroom || ch->in_room != ch->leader->in_room)
	{
		if (ch->in_room != ch->leader->in_room)
		{
			char_from_room(ch);
			char_to_room(ch, ch->leader->in_room);
		}

		do_say(ch, "I can't seem to lead us over there from here.  Try heading back to another part of town?");

		ch->leader->master = ch;
		ch->master = ch->leader;
		return;
	}

	WAIT_STATE(ch->leader, PULSE_VIOLENCE);

	RS.Queue.AddToQueue(2, "apet_walk_to_room", "apet_walk_to_room", apet_walk_to_room, ch, vnum);
}